

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_chorba_c.c
# Opt level: O0

uint32_t crc32_chorba_32768_nondestructive(uint32_t crc,uint64_t *buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong in_RDX;
  long in_RSI;
  uint in_EDI;
  size_t j;
  uint8_t *final_bytes;
  uint64_t out5;
  uint64_t out4;
  uint64_t out3;
  uint64_t out2;
  uint64_t out1;
  uint64_t d4;
  uint64_t d3;
  uint64_t d2;
  uint64_t d1;
  uint64_t c4;
  uint64_t c3;
  uint64_t c2;
  uint64_t c1;
  uint64_t b4;
  uint64_t b3;
  uint64_t b2;
  uint64_t b1;
  uint64_t a4;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t in4_1;
  uint64_t in3_1;
  uint64_t in2_1;
  uint64_t in1_1;
  uint64_t final [9];
  uint64_t next5_64;
  uint64_t next4_64;
  uint64_t next3_64;
  uint64_t next2_64;
  uint64_t next1_64;
  size_t inoffset;
  uint64_t in8;
  uint64_t in7;
  uint64_t in6;
  uint64_t in5;
  uint64_t in4;
  uint64_t in3;
  uint64_t in2;
  uint64_t in1;
  size_t i;
  uint8_t *bitbufferbytes;
  uint64_t bitbuffer [4096];
  uint64_t *input;
  ulong local_81d0;
  byte local_80f8 [80];
  ulong local_80a8;
  ulong local_80a0;
  ulong local_8098;
  ulong local_8090;
  ulong local_8088;
  ulong local_8080;
  ulong local_8078;
  ulong local_8070;
  ulong local_8068;
  ulong local_8060;
  ulong local_8058;
  ulong local_8050;
  ulong local_8048;
  ulong local_8040;
  ulong local_8038;
  ulong *local_8030;
  ulong local_8028 [145];
  ulong auStack_7ba0 [38];
  ulong auStack_7a70 [28];
  ulong auStack_7990 [89];
  ulong auStack_76c8 [3797];
  long local_20;
  ulong local_18;
  uint local_4;
  
  local_8030 = local_8028;
  local_20 = in_RSI;
  local_18 = in_RDX;
  local_4 = in_EDI;
  memset(local_8028,0,0x8000);
  local_8028[0] = local_4 ^ local_8028[0];
  local_4 = 0;
  for (local_8038 = 0; local_8038 + 0x9a0 < local_18; local_8038 = local_8038 + 0x40) {
    local_8080 = local_8038 >> 3;
    local_8040 = *(ulong *)(local_20 + local_8038) ^ local_8028[local_8080];
    local_8048 = *(ulong *)(local_20 + 8 + local_8038) ^ local_8028[local_8080 + 1];
    local_8050 = *(ulong *)(local_20 + 0x10 + local_8038) ^ local_8028[local_8080 + 2];
    local_8058 = *(ulong *)(local_20 + 0x18 + local_8038) ^ local_8028[local_8080 + 3];
    local_8060 = *(ulong *)(local_20 + 0x20 + local_8038) ^ local_8028[local_8080 + 4];
    local_8068 = *(ulong *)(local_20 + 0x28 + local_8038) ^ local_8028[local_8080 + 5];
    local_8070 = *(ulong *)(local_20 + 0x30 + local_8038) ^ local_8028[local_8080 + 6];
    local_8078 = *(ulong *)(local_20 + 0x38 + local_8038) ^ local_8028[local_8080 + 7];
    auStack_7ba0[local_8038 >> 3] = local_8040 ^ auStack_7ba0[local_8038 >> 3];
    auStack_7ba0[(local_8038 >> 3) + 1] = local_8048 ^ auStack_7ba0[(local_8038 >> 3) + 1];
    auStack_7ba0[(local_8038 >> 3) + 2] = local_8050 ^ auStack_7ba0[(local_8038 >> 3) + 2];
    auStack_7ba0[(local_8038 >> 3) + 3] = local_8058 ^ auStack_7ba0[(local_8038 >> 3) + 3];
    auStack_7ba0[(local_8038 >> 3) + 4] = local_8060 ^ auStack_7ba0[(local_8038 >> 3) + 4];
    auStack_7ba0[(local_8038 >> 3) + 5] = local_8068 ^ auStack_7ba0[(local_8038 >> 3) + 5];
    auStack_7ba0[(local_8038 >> 3) + 6] = local_8070 ^ auStack_7ba0[(local_8038 >> 3) + 6];
    auStack_7ba0[(local_8038 >> 3) + 7] = local_8078 ^ auStack_7ba0[(local_8038 >> 3) + 7];
    auStack_7a70[local_8038 >> 3] = local_8040 ^ auStack_7a70[local_8038 >> 3];
    auStack_7a70[(local_8038 >> 3) + 1] = local_8048 ^ auStack_7a70[(local_8038 >> 3) + 1];
    auStack_7a70[(local_8038 >> 3) + 2] = local_8050 ^ auStack_7a70[(local_8038 >> 3) + 2];
    auStack_7a70[(local_8038 >> 3) + 3] = local_8058 ^ auStack_7a70[(local_8038 >> 3) + 3];
    auStack_7a70[(local_8038 >> 3) + 4] = local_8060 ^ auStack_7a70[(local_8038 >> 3) + 4];
    auStack_7a70[(local_8038 >> 3) + 5] = local_8068 ^ auStack_7a70[(local_8038 >> 3) + 5];
    auStack_7a70[(local_8038 >> 3) + 6] = local_8070 ^ auStack_7a70[(local_8038 >> 3) + 6];
    auStack_7a70[(local_8038 >> 3) + 7] = local_8078 ^ auStack_7a70[(local_8038 >> 3) + 7];
    auStack_7990[local_8038 >> 3] = local_8040 ^ auStack_7990[local_8038 >> 3];
    auStack_7990[(local_8038 >> 3) + 1] = local_8048 ^ auStack_7990[(local_8038 >> 3) + 1];
    auStack_7990[(local_8038 >> 3) + 2] = local_8050 ^ auStack_7990[(local_8038 >> 3) + 2];
    auStack_7990[(local_8038 >> 3) + 3] = local_8058 ^ auStack_7990[(local_8038 >> 3) + 3];
    auStack_7990[(local_8038 >> 3) + 4] = local_8060 ^ auStack_7990[(local_8038 >> 3) + 4];
    auStack_7990[(local_8038 >> 3) + 5] = local_8068 ^ auStack_7990[(local_8038 >> 3) + 5];
    auStack_7990[(local_8038 >> 3) + 6] = local_8070 ^ auStack_7990[(local_8038 >> 3) + 6];
    auStack_7990[(local_8038 >> 3) + 7] = local_8078 ^ auStack_7990[(local_8038 >> 3) + 7];
    *(ulong *)((long)auStack_76c8 + local_8038) = local_8040;
    *(ulong *)((long)auStack_76c8 + local_8038 + 8) = local_8048;
    *(ulong *)((long)auStack_76c8 + local_8038 + 0x10) = local_8050;
    *(ulong *)((long)auStack_76c8 + local_8038 + 0x18) = local_8058;
    *(ulong *)((long)auStack_76c8 + local_8038 + 0x20) = local_8060;
    *(ulong *)((long)auStack_76c8 + local_8038 + 0x28) = local_8068;
    *(ulong *)((long)auStack_76c8 + local_8038 + 0x30) = local_8070;
    *(ulong *)((long)auStack_76c8 + local_8038 + 0x38) = local_8078;
  }
  local_8088 = 0;
  local_8090 = 0;
  local_8098 = 0;
  local_80a0 = 0;
  local_80a8 = 0;
  memset(local_80f8,0,0x48);
  for (; local_8038 + 0x48 < local_18; local_8038 = local_8038 + 0x20) {
    local_8088 = local_8088 ^
                 *(ulong *)(local_20 + (local_8038 & 0xfffffffffffffff8)) ^
                 *(ulong *)((long)local_8028 + (local_8038 & 0xfffffffffffffff8));
    uVar1 = local_8090 ^
            *(ulong *)(local_20 + (local_8038 + 8 & 0xfffffffffffffff8)) ^
            *(ulong *)((long)local_8028 + (local_8038 & 0xfffffffffffffff8) + 8);
    uVar2 = local_8098 ^ local_8088 << 0x11 ^ local_8088 << 0x37 ^
            *(ulong *)(local_20 + (local_8038 + 0x10 & 0xfffffffffffffff8)) ^
            *(ulong *)((long)local_8028 + (local_8038 & 0xfffffffffffffff8) + 0x10);
    uVar3 = local_80a0 ^ local_8088 >> 0x2f ^ local_8088 >> 9 ^ local_8088 << 0x13 ^
            uVar1 << 0x11 ^ uVar1 << 0x37 ^
            *(ulong *)(local_20 + (local_8038 + 0x18 & 0xfffffffffffffff8)) ^
            *(ulong *)((long)local_8028 + (local_8038 & 0xfffffffffffffff8) + 0x18);
    local_8090 = local_8088 >> 0x14 ^ uVar1 >> 0x2d ^ uVar1 << 0x2c ^
                 uVar2 >> 0x2f ^ uVar2 >> 9 ^ uVar2 << 0x13 ^ uVar3 << 0x11 ^ uVar3 << 0x37;
    local_8098 = uVar1 >> 0x14 ^ uVar2 >> 0x2d ^ uVar2 << 0x2c ^
                 uVar3 >> 0x2f ^ uVar3 >> 9 ^ uVar3 << 0x13;
    local_80a0 = uVar2 >> 0x14 ^ uVar3 >> 0x2d ^ uVar3 << 0x2c;
    local_8088 = local_80a8 ^
                 local_8088 >> 0x2d ^ local_8088 << 0x2c ^
                 uVar1 >> 0x2f ^ uVar1 >> 9 ^ uVar1 << 0x13 ^ uVar2 << 0x11 ^ uVar2 << 0x37;
    local_80a8 = uVar3 >> 0x14;
  }
  memcpy(local_80f8,(void *)(local_20 + (local_8038 & 0xfffffffffffffff8)),local_18 - local_8038);
  for (local_81d0 = 0; local_81d0 < local_18 - local_8038; local_81d0 = local_81d0 + 1) {
    local_4 = crc_table[(local_4 ^ local_80f8[local_81d0] ^
                        (uint)*(byte *)((long)local_8030 + local_81d0 + local_8038)) & 0xff] ^
              local_4 >> 8;
  }
  return local_4;
}

Assistant:

Z_INTERNAL uint32_t crc32_chorba_32768_nondestructive (uint32_t crc, const uint64_t* buf, size_t len) {
    const uint64_t* input = buf;
    uint64_t bitbuffer[32768 / sizeof(uint64_t)];
    const uint8_t* bitbufferbytes = (const uint8_t*) bitbuffer;
    memset(bitbuffer, 0, 32768);
    bitbuffer[0] ^= crc;
    crc = 0;

    size_t i = 0;

    for(; i + 300*8+64 < len; i += 64) {
        uint64_t in1, in2, in3, in4;
        uint64_t in5, in6, in7, in8;
        size_t inoffset = (i/8);

        in1 = input[i / sizeof(uint64_t) + 0] ^ bitbuffer[inoffset + 0];
        in2 = input[i / sizeof(uint64_t) + 1] ^ bitbuffer[inoffset + 1];
        in3 = input[i / sizeof(uint64_t) + 2] ^ bitbuffer[inoffset + 2];
        in4 = input[i / sizeof(uint64_t) + 3] ^ bitbuffer[inoffset + 3];
        in5 = input[i / sizeof(uint64_t) + 4] ^ bitbuffer[inoffset + 4];
        in6 = input[i / sizeof(uint64_t) + 5] ^ bitbuffer[inoffset + 5];
        in7 = input[i / sizeof(uint64_t) + 6] ^ bitbuffer[inoffset + 6];
        in8 = input[i / sizeof(uint64_t) + 7] ^ bitbuffer[inoffset + 7];

        // [0, 145, 183, 211]

        bitbuffer[(i/8 + 0 + 145)] ^= in1;
        bitbuffer[(i/8 + 1 + 145)] ^= in2;
        bitbuffer[(i/8 + 2 + 145)] ^= in3;
        bitbuffer[(i/8 + 3 + 145)] ^= in4;
        bitbuffer[(i/8 + 4 + 145)] ^= in5;
        bitbuffer[(i/8 + 5 + 145)] ^= in6;
        bitbuffer[(i/8 + 6 + 145)] ^= in7;
        bitbuffer[(i/8 + 7 + 145)] ^= in8;

        bitbuffer[(i/8 + 0 + 183)] ^= in1;
        bitbuffer[(i/8 + 1 + 183)] ^= in2;
        bitbuffer[(i/8 + 2 + 183)] ^= in3;
        bitbuffer[(i/8 + 3 + 183)] ^= in4;
        bitbuffer[(i/8 + 4 + 183)] ^= in5;
        bitbuffer[(i/8 + 5 + 183)] ^= in6;
        bitbuffer[(i/8 + 6 + 183)] ^= in7;
        bitbuffer[(i/8 + 7 + 183)] ^= in8;

        bitbuffer[(i/8 + 0 + 211)] ^= in1;
        bitbuffer[(i/8 + 1 + 211)] ^= in2;
        bitbuffer[(i/8 + 2 + 211)] ^= in3;
        bitbuffer[(i/8 + 3 + 211)] ^= in4;
        bitbuffer[(i/8 + 4 + 211)] ^= in5;
        bitbuffer[(i/8 + 5 + 211)] ^= in6;
        bitbuffer[(i/8 + 6 + 211)] ^= in7;
        bitbuffer[(i/8 + 7 + 211)] ^= in8;

        bitbuffer[(i/8 + 0 + 300)] = in1;
        bitbuffer[(i/8 + 1 + 300)] = in2;
        bitbuffer[(i/8 + 2 + 300)] = in3;
        bitbuffer[(i/8 + 3 + 300)] = in4;
        bitbuffer[(i/8 + 4 + 300)] = in5;
        bitbuffer[(i/8 + 5 + 300)] = in6;
        bitbuffer[(i/8 + 6 + 300)] = in7;
        bitbuffer[(i/8 + 7 + 300)] = in8;
    }

    uint64_t next1_64 = 0;
    uint64_t next2_64 = 0;
    uint64_t next3_64 = 0;
    uint64_t next4_64 = 0;
    uint64_t next5_64 = 0;
    uint64_t final[9] = {0};

    for(; (i + 72 < len); i += 32) {
        uint64_t in1;
        uint64_t in2;
        uint64_t in3;
        uint64_t in4;
        uint64_t a1, a2, a3, a4;
        uint64_t b1, b2, b3, b4;
        uint64_t c1, c2, c3, c4;
        uint64_t d1, d2, d3, d4;

        uint64_t out1;
        uint64_t out2;
        uint64_t out3;
        uint64_t out4;
        uint64_t out5;

        in1 = input[i / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t))];
        in2 = input[(i + 8) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 1)];
#if BYTE_ORDER == BIG_ENDIAN
        in1 = ZSWAP64(in1);
        in2 = ZSWAP64(in2);
#endif
        in1 ^= next1_64;
        in2 ^= next2_64;

        a1 = (in1 << 17) ^ (in1 << 55);
        a2 = (in1 >> 47) ^ (in1 >> 9) ^ (in1 << 19);
        a3 = (in1 >> 45) ^ (in1 << 44);
        a4 = (in1 >> 20);

        b1 = (in2 << 17) ^ (in2 << 55);
        b2 = (in2 >> 47) ^ (in2 >> 9) ^ (in2 << 19);
        b3 = (in2 >> 45) ^ (in2 << 44);
        b4 = (in2 >> 20);

        in3 = input[(i + 16) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 2)];
        in4 = input[(i + 24) / sizeof(z_word_t)] ^ bitbuffer[(i / sizeof(uint64_t) + 3)];
#if BYTE_ORDER == BIG_ENDIAN
        in3 = ZSWAP64(in3);
        in4 = ZSWAP64(in4);
#endif
        in3 ^= next3_64 ^ a1;
        in4 ^= next4_64 ^ a2 ^ b1;

        c1 = (in3 << 17) ^ (in3 << 55);
        c2 = (in3 >> 47) ^ (in3 >> 9) ^ (in3 << 19);
        c3 = (in3 >> 45) ^ (in3 << 44);
        c4 = (in3 >> 20);

        d1 = (in4 << 17) ^ (in4 << 55);
        d2 = (in4 >> 47) ^ (in4 >> 9) ^ (in4 << 19);
        d3 = (in4 >> 45) ^ (in4 << 44);
        d4 = (in4 >> 20);

        out1 = a3 ^ b2 ^ c1;
        out2 = a4 ^ b3 ^ c2 ^ d1;
        out3 = b4 ^ c3 ^ d2;
        out4 = c4 ^ d3;
        out5 = d4;

        next1_64 = next5_64 ^ out1;
        next2_64 = out2;
        next3_64 = out3;
        next4_64 = out4;
        next5_64 = out5;

    }

#if BYTE_ORDER == BIG_ENDIAN
    next1_64 = ZSWAP64(next1_64);
    next2_64 = ZSWAP64(next2_64);
    next3_64 = ZSWAP64(next3_64);
    next4_64 = ZSWAP64(next4_64);
    next5_64 = ZSWAP64(next5_64);
#endif

    memcpy(final, input+(i / sizeof(uint64_t)), len-i);
    final[0] ^= next1_64;
    final[1] ^= next2_64;
    final[2] ^= next3_64;
    final[3] ^= next4_64;
    final[4] ^= next5_64;

    uint8_t* final_bytes = (uint8_t*) final;

    for(size_t j = 0; j < (len-i); j++) {
        crc = crc_table[(crc ^ final_bytes[j] ^ bitbufferbytes[(j+i)]) & 0xff] ^ (crc >> 8);
    }
    return crc;
}